

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<capnp::(anonymous_namespace)::MembraneRequestHook>::disposeImpl
          (HeapDisposer<capnp::(anonymous_namespace)::MembraneRequestHook> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    Own<capnp::MembranePolicy>::dispose((Own<capnp::MembranePolicy> *)((long)pointer + 0x18));
    Own<capnp::RequestHook>::dispose((Own<capnp::RequestHook> *)((long)pointer + 8));
  }
  operator_delete(pointer,0x50);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }